

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreCommands.cpp
# Opt level: O3

ResponseLine * __thiscall
RehashGenericCommand::trigger(RehashGenericCommand *this,string_view parameters)

{
  string *psVar1;
  long lVar2;
  ResponseLine *pRVar3;
  undefined8 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_50;
  string local_30;
  
  lVar2 = Jupiter::rehash();
  pRVar3 = (ResponseLine *)operator_new(0x30);
  if (lVar2 == 0) {
    uVar4 = Jupiter::getRehashableCount();
    string_printf_abi_cxx11_(&local_30,"All %u objects were successfully rehashed.",uVar4);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,&local_30,0);
    psVar1 = &local_30;
  }
  else {
    uVar4 = Jupiter::getRehashableCount();
    string_printf_abi_cxx11_
              (&local_50,"%u of %u objects failed to successfully rehash.",lVar2,uVar4);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar3,&local_50,2);
    psVar1 = &local_50;
  }
  paVar5 = &psVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar5->_M_allocated_capacity)[-2] != paVar5) {
    operator_delete((undefined1 *)(&paVar5->_M_allocated_capacity)[-2],
                    paVar5->_M_allocated_capacity + 1);
  }
  return pRVar3;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *RehashGenericCommand::trigger(std::string_view parameters) {
	size_t hash_errors = Jupiter::rehash();

	if (hash_errors == 0)
		return new Jupiter::GenericCommand::ResponseLine(string_printf("All %u objects were successfully rehashed.", Jupiter::getRehashableCount()), GenericCommand::DisplayType::PublicSuccess);

	return new Jupiter::GenericCommand::ResponseLine(string_printf("%u of %u objects failed to successfully rehash.", hash_errors, Jupiter::getRehashableCount()), GenericCommand::DisplayType::PublicError);
}